

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::detail::fixed_dynamic_array<char,_3080U,_std::allocator<unsigned_int>_>::
fixed_dynamic_array(fixed_dynamic_array<char,_3080U,_std::allocator<unsigned_int>_> *this,
                   size_type size_in,value_type *value_in,allocator_type *alloc_in)

{
  uint uVar1;
  iterator first;
  iterator pvVar2;
  size_type local_34;
  uint local_30;
  value_type local_29;
  allocator_type *local_28;
  allocator_type *alloc_in_local;
  value_type *value_in_local;
  fixed_dynamic_array<char,_3080U,_std::allocator<unsigned_int>_> *pfStack_10;
  size_type size_in_local;
  fixed_dynamic_array<char,_2056U,_std::allocator<unsigned_int>_> *this_local;
  
  local_29 = '\0';
  local_28 = alloc_in;
  alloc_in_local = (allocator_type *)value_in;
  value_in_local._4_4_ = size_in;
  pfStack_10 = this;
  util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this,0xc08,
             &local_29,alloc_in);
  *(undefined ***)this = &PTR__fixed_dynamic_array_00372c60;
  first = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                    ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this);
  pvVar2 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                     ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this);
  local_30 = 0xc08;
  local_34 = value_in_local._4_4_;
  uVar1 = min_unsafe<unsigned_int>(&local_30,&local_34);
  fill_unsafe<char*,char>(first,pvVar2 + uVar1,(char)*alloc_in_local);
  return;
}

Assistant:

explicit constexpr fixed_dynamic_array(const typename base_class_type::size_type       size_in  = MySize,
                                           const typename base_class_type::value_type&     value_in = typename base_class_type::value_type(),
                                           const typename base_class_type::allocator_type& alloc_in = typename base_class_type::allocator_type())
      : base_class_type(MySize, typename base_class_type::value_type(), alloc_in)
    {
      detail::fill_unsafe(base_class_type::begin(),
                          base_class_type::begin() + (detail::min_unsafe)(MySize, static_cast<typename base_class_type::size_type>(size_in)),
                          value_in);
    }